

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# durand_kerner_method.cc
# Opt level: O0

bool __thiscall
sptk::DurandKernerMethod::Run
          (DurandKernerMethod *this,vector<double,_std::allocator<double>_> *coefficients,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *roots,
          bool *is_converged)

{
  size_type sVar1;
  const_reference pvVar2;
  complex<double> *this_00;
  undefined1 *in_RCX;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  complex<double> delta;
  int l;
  complex<double> denominator;
  complex<double> numerator;
  int m_2;
  bool halt;
  int n;
  int m_1;
  double center;
  double r;
  int m;
  double radius;
  complex<double> *x;
  double *a;
  complex<double> *in_stack_fffffffffffffec8;
  complex<double> *in_stack_fffffffffffffed0;
  size_type in_stack_fffffffffffffee8;
  reference this_01;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_fffffffffffffef0;
  double dVar6;
  complex<double> local_c0;
  undefined8 local_a8;
  undefined8 local_98;
  int local_8c;
  complex<double> local_88;
  complex<double> local_78;
  int local_68;
  byte local_61;
  int local_60;
  int local_5c;
  double local_58;
  double local_50;
  int local_44;
  double local_40;
  reference local_38;
  double *local_30;
  undefined1 *local_28;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  bool local_1;
  
  if (((((*(byte *)(in_RDI + 0x18) & 1) == 0) ||
       (local_28 = in_RCX, local_20 = in_RDX, local_18 = in_RSI,
       sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar1 != (long)*(int *)(in_RDI + 8))) ||
      (local_20 == (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x0)) ||
     (local_28 == (undefined1 *)0x0)) {
    local_1 = false;
  }
  else {
    sVar1 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                      (local_20);
    if (sVar1 != (long)*(int *)(in_RDI + 8)) {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
    local_30 = std::vector<double,_std::allocator<double>_>::operator[](local_18,0);
    local_38 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         (local_20,0);
    *local_28 = 0;
    local_40 = 0.0;
    for (local_44 = 1; local_44 < *(int *)(in_RDI + 8); local_44 = local_44 + 1) {
      local_50 = pow(ABS(local_30[local_44]),1.0 / (double)(local_44 + 1));
      local_50 = local_50 * 2.0;
      if (local_40 < local_50) {
        local_40 = local_50;
      }
    }
    local_58 = -*local_30 / (double)*(int *)(in_RDI + 8);
    for (local_5c = 0; dVar6 = local_40, dVar3 = local_58, local_5c < *(int *)(in_RDI + 8);
        local_5c = local_5c + 1) {
      this_01 = local_38 + local_5c;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)local_5c)
      ;
      std::complex<double>::real(this_01,dVar6 * *pvVar2 + dVar3);
      dVar3 = local_58;
      this_00 = local_38 + local_5c;
      dVar6 = local_40;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),(long)local_5c)
      ;
      std::complex<double>::imag(this_00,dVar6 * *pvVar2 + dVar3);
    }
    for (local_60 = 0; local_60 < *(int *)(in_RDI + 0xc); local_60 = local_60 + 1) {
      local_61 = 1;
      for (local_68 = 0; local_68 < *(int *)(in_RDI + 8); local_68 = local_68 + 1) {
        std::complex<double>::complex(&local_78,1.0,0.0);
        uVar4 = 0;
        uVar5 = 0;
        std::complex<double>::complex(&local_88,1.0,0.0);
        for (local_8c = 0; local_8c < *(int *)(in_RDI + 8); local_8c = local_8c + 1) {
          std::operator*(in_stack_fffffffffffffec8,(complex<double> *)0x10b60d);
          local_a8 = CONCAT44(uVar5,uVar4);
          uVar4 = 0;
          uVar5 = 0;
          std::complex<double>::complex(&local_c0,local_30[local_8c],0.0);
          std::operator+(in_stack_fffffffffffffec8,(complex<double> *)0x10b653);
          local_98._4_4_ = uVar5;
          local_98._0_4_ = uVar4;
          local_78._M_value._8_8_ = local_98;
          if (local_68 != local_8c) {
            std::operator-(in_stack_fffffffffffffec8,(complex<double> *)0x10b6c8);
            std::operator*(in_stack_fffffffffffffec8,(complex<double> *)0x10b6e6);
            local_88._M_value._12_4_ = uVar5;
            local_88._M_value._8_4_ = uVar4;
          }
        }
        dVar3 = std::complex<double>::real_abi_cxx11_(&local_88);
        if ((dVar3 != 0.0) || (NAN(dVar3))) {
LAB_0010b77b:
          std::operator/(in_stack_fffffffffffffec8,(complex<double> *)0x10b790);
          std::complex<double>::operator-=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          if ((local_61 & 1) != 0) {
            in_stack_fffffffffffffed0 = *(complex<double> **)(in_RDI + 0x10);
            dVar3 = std::abs<double>(in_stack_fffffffffffffed0);
            if ((double)in_stack_fffffffffffffed0 < dVar3) {
              local_61 = 0;
            }
          }
        }
        else {
          dVar3 = std::complex<double>::imag_abi_cxx11_(&local_88);
          if ((dVar3 != 0.0) || (NAN(dVar3))) goto LAB_0010b77b;
          std::complex<double>::operator=(local_38 + local_68,0.0);
        }
      }
      if ((local_61 & 1) != 0) {
        *local_28 = 1;
        break;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool DurandKernerMethod::Run(const std::vector<double>& coefficients,
                             std::vector<std::complex<double> >* roots,
                             bool* is_converged) const {
  // Check inputs.
  if (!is_valid_ ||
      coefficients.size() != static_cast<std::size_t>(num_order_) ||
      NULL == roots || NULL == is_converged) {
    return false;
  }

  // Prepare memories.
  if (roots->size() != static_cast<std::size_t>(num_order_)) {
    roots->resize(num_order_);
  }

  const double* a(&(coefficients[0]));
  std::complex<double>* x(&((*roots)[0]));

  *is_converged = false;

  // Set initial roots using the Aberth's approach.
  {
    double radius(0.0);
    for (int m(1); m < num_order_; ++m) {
      const double r(2.0 * std::pow(std::fabs(a[m]), 1.0 / (m + 1)));
      if (radius < r) {
        radius = r;
      }
    }

    const double center(-a[0] / num_order_);
    for (int m(0); m < num_order_; ++m) {
      x[m].real(center + radius * cosine_table_[m]);
      x[m].imag(center + radius * sine_table_[m]);
    }
  }

  // Find roots using the Durand-Kerner method.
  for (int n(0); n < num_iteration_; ++n) {
    bool halt(true);

    for (int m(0); m < num_order_; ++m) {
      std::complex<double> numerator(1.0);
      std::complex<double> denominator(1.0);
      for (int l(0); l < num_order_; ++l) {
        numerator = numerator * x[m] + std::complex<double>(a[l]);
        if (m != l) denominator = denominator * (x[m] - x[l]);
      }
      if (0.0 == denominator.real() && 0.0 == denominator.imag()) {
        x[m] = 0.0;
      } else {
        const std::complex<double> delta(numerator / denominator);
        x[m] -= delta;
        if (halt && convergence_threshold_ < std::abs(delta)) {
          halt = false;
        }
      }
    }

    if (halt) {
      *is_converged = true;
      break;
    }
  }

  return true;
}